

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

int Fraig_ManSimulateBitNode_rec(Fraig_Man_t *p,Fraig_Node_t *pNode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int Value1;
  int Value0;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *p_local;
  
  iVar1 = Fraig_NodeIsTravIdCurrent(p,pNode);
  if (iVar1 == 0) {
    Fraig_NodeSetTravIdCurrent(p,pNode);
    uVar2 = Fraig_ManSimulateBitNode_rec(p,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
    uVar3 = Fraig_ManSimulateBitNode_rec(p,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe));
    *(uint *)&pNode->field_0x18 =
         *(uint *)&pNode->field_0x18 & 0xffffffbf |
         (((uint)pNode->p1 & 1 ^ uVar2) & ((uint)pNode->p2 & 1 ^ uVar3) & 1) << 6;
    uVar2 = *(uint *)&pNode->field_0x18;
  }
  else {
    uVar2 = *(uint *)&pNode->field_0x18;
  }
  p_local._4_4_ = uVar2 >> 6 & 1;
  return p_local._4_4_;
}

Assistant:

int Fraig_ManSimulateBitNode_rec( Fraig_Man_t * p, Fraig_Node_t * pNode )
{
    int Value0, Value1;
    if ( Fraig_NodeIsTravIdCurrent( p, pNode ) )
        return pNode->fMark3;
    Fraig_NodeSetTravIdCurrent( p, pNode );
    Value0 = Fraig_ManSimulateBitNode_rec( p, Fraig_Regular(pNode->p1) );
    Value1 = Fraig_ManSimulateBitNode_rec( p, Fraig_Regular(pNode->p2) );
    Value0 ^= Fraig_IsComplement(pNode->p1);
    Value1 ^= Fraig_IsComplement(pNode->p2);
    pNode->fMark3 = Value0 & Value1;
    return pNode->fMark3;
}